

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  bool bVar1;
  float *local_1b0;
  size_t local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)pTargetString);
  local_1b0 = &pArray->a;
  local_1a0 = pArray_Size;
  while (bVar1 = local_1a0 != 0, local_1a0 = local_1a0 - 1, bVar1) {
    std::__cxx11::to_string(&local_f0,((aiColor4D *)(local_1b0 + -3))->r);
    std::operator+(&local_190,&local_f0," ");
    std::__cxx11::to_string(&local_d0,local_1b0[-2]);
    std::operator+(&local_b0,&local_190,&local_d0);
    std::operator+(&local_170,&local_b0," ");
    std::__cxx11::to_string(&local_110,local_1b0[-1]);
    std::operator+(&local_90,&local_170,&local_110);
    std::operator+(&local_150,&local_90," ");
    std::__cxx11::to_string(&local_130,*local_1b0);
    std::operator+(&local_70,&local_150,&local_130);
    std::operator+(&local_50,&local_70," ");
    std::__cxx11::string::append((string *)pTargetString);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_f0);
    local_1b0 = local_1b0 + 4;
  }
  std::__cxx11::string::resize((ulong)pTargetString);
  AttrHelper_CommaToPoint(this,pTargetString);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}